

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

void yang_type_free(ly_ctx *ctx,lys_type *type)

{
  lys_tpdf *__ptr;
  int local_24;
  int i;
  yang_type *stype;
  lys_type *type_local;
  ly_ctx *ctx_local;
  
  __ptr = type->der;
  if (__ptr != (lys_tpdf *)0x0) {
    if (((type->base == LY_TYPE_DER) || (type->base == LY_TYPE_ERR)) ||
       (type->base == LY_TYPE_UNION)) {
      lydict_remove(ctx,__ptr->dsc);
      if ((*(int *)((long)&__ptr->name + 4) == 7) && (((ulong)__ptr->name & 0x20) == 0)) {
        for (local_24 = 0; local_24 < (type->info).bits.count; local_24 = local_24 + 1) {
          free((&((type->info).bits.bit)->name)[local_24]);
        }
      }
      if (*(int *)((long)&__ptr->name + 4) == 0xb) {
        for (local_24 = 0; local_24 < (type->info).bits.count; local_24 = local_24 + 1) {
          yang_type_free(ctx,(lys_type *)((long)(type->info).bits.bit + (long)local_24 * 0x40));
        }
        free((type->info).bits.bit);
        type->base = LY_TYPE_DER;
      }
      else {
        type->base = *(LY_DATA_TYPE *)((long)&__ptr->name + 4);
      }
      free(__ptr);
      type->der = (lys_tpdf *)0x0;
    }
    lys_type_free(ctx,type);
    type->base = LY_TYPE_DER;
    type->ext_size = '\0';
    type->ext = (lys_ext_instance **)0x0;
  }
  return;
}

Assistant:

void
yang_type_free(struct ly_ctx *ctx, struct lys_type *type)
{
    struct yang_type *stype = (struct yang_type *)type->der;
    int i;

    if (!stype) {
        return ;
    }
    if (type->base == LY_TYPE_DER || type->base == LY_TYPE_ERR || type->base == LY_TYPE_UNION) {
        lydict_remove(ctx, stype->name);
        if (stype->base == LY_TYPE_IDENT && (!(stype->flags & LYS_NO_ERASE_IDENTITY))) {
            for (i = 0; i < type->info.ident.count; ++i) {
                free(type->info.ident.ref[i]);
            }
        }
        if (stype->base == LY_TYPE_UNION) {
            for (i = 0; i < type->info.uni.count; ++i) {
                yang_type_free(ctx, &type->info.uni.types[i]);
            }
            free(type->info.uni.types);
            type->base = LY_TYPE_DER;
        } else {
            type->base = stype->base;
        }
        free(stype);
        type->der = NULL;
    }
    lys_type_free(ctx, type);
    type->base = LY_TYPE_DER;
    type->ext_size = 0;
    type->ext = NULL;
}